

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

node * make_simple_tree(float32 **means,float32 **vars,float32 ***mixw,int32 *nodephoneids,
                       int32 nphones,int32 ndensity,int32 nfeat,int32 ndim,int32 npermute,
                       int32 depth,int32 continuous)

{
  float fVar1;
  float fVar2;
  float32 *pfVar3;
  float32 *pfVar4;
  float32 *pfVar5;
  float32 *pfVar6;
  int32 *piVar7;
  float32 *pfVar8;
  float32 *pfVar9;
  double dVar10;
  ulong uVar11;
  int32 **ppiVar12;
  float32 ***pppfVar13;
  node *pnVar14;
  int32 *piVar15;
  cmd_ln_t *cmdln;
  float32 **ppfVar16;
  node *pnVar17;
  uint nsets;
  int iVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  float32 **ppfVar27;
  float32 **pvars;
  size_t n_elem;
  ulong uVar28;
  ulong uVar29;
  size_t d2;
  float fVar30;
  float32 fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  int32 npermute_00;
  int32 **local_d0;
  float32 **local_c8;
  float32 ***local_b8;
  int32 b;
  int32 a;
  float32 **local_a8;
  float32 **local_a0;
  int32 **local_98;
  float32 **local_90;
  float32 ***local_88;
  float32 **local_80;
  float32 **local_78;
  float32 **local_70;
  float32 ***local_68;
  ulong local_60;
  float32 **local_58;
  int32 rnphones;
  int32 lnphones;
  node *local_48;
  int32 *rphoneids;
  int32 *lphoneids;
  
  uVar11 = (ulong)(uint)ndensity;
  local_78 = means;
  local_70 = vars;
  local_68 = mixw;
  pnVar14 = (node *)__ckd_calloc__(1,0x30,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                   ,0x16b);
  n_elem = (size_t)nphones;
  piVar15 = (int32 *)__ckd_calloc__(n_elem,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                    ,0x16c);
  pnVar14->phoneids = piVar15;
  pnVar14->nphones = nphones;
  memcpy(piVar15,nodephoneids,n_elem * 4);
  pnVar14->depth = depth;
  local_48 = pnVar14;
  local_b8 = (float32 ***)
             __ckd_calloc_3d__(n_elem,(long)nfeat,(long)ndensity,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                               ,0x172);
  local_88 = (float32 ***)
             __ckd_calloc_3d__(n_elem,(long)nfeat,(long)ndensity,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                               ,0x173);
  local_d0 = (int32 **)
             __ckd_calloc_2d__(n_elem,n_elem,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                               ,0x174);
  local_90 = (float32 **)
             __ckd_calloc__(n_elem,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                            ,0x175);
  local_98 = (int32 **)
             __ckd_calloc_2d__(n_elem,n_elem,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                               ,0x176);
  local_80 = (float32 **)
             __ckd_calloc__(n_elem,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                            ,0x177);
  if (continuous == 0) {
    fVar30 = 0.0;
    local_c8 = (float32 **)0x0;
    local_a0 = (float32 **)0x0;
    ppfVar16 = (float32 **)0x0;
    local_a8 = (float32 **)0x0;
  }
  else {
    cmdln = cmd_ln_get();
    dVar10 = cmd_ln_float_r(cmdln,"-varfloor");
    fVar30 = (float)dVar10;
    d2 = (size_t)ndim;
    local_a8 = (float32 **)
               __ckd_calloc_2d__(n_elem,d2,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                 ,0x17b);
    ppfVar16 = (float32 **)
               __ckd_calloc_2d__(n_elem,d2,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                 ,0x17c);
    local_a0 = (float32 **)
               __ckd_calloc_2d__(n_elem,d2,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                 ,0x17d);
    local_c8 = (float32 **)
               __ckd_calloc_2d__(n_elem,d2,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                 ,0x17e);
  }
  local_60 = (ulong)(uint)npermute;
  uVar28 = (ulong)(uint)nfeat;
  uVar29 = (ulong)(uint)ndim;
  if (0 < nphones) {
    uVar19 = 0;
    do {
      *(undefined4 *)((long)local_90 + uVar19 * 4) = 1;
      *local_d0[uVar19] = nodephoneids[uVar19];
      if (0 < nfeat) {
        uVar21 = 0;
        do {
          if (0 < ndensity) {
            pfVar3 = local_68[nodephoneids[uVar19]][uVar21];
            pfVar4 = local_b8[uVar19][uVar21];
            uVar25 = 0;
            do {
              pfVar4[uVar25] = pfVar3[uVar25];
              uVar25 = uVar25 + 1;
            } while (uVar11 != uVar25);
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 != uVar28);
      }
      if (0 < ndim && continuous != 0) {
        pfVar3 = local_78[nodephoneids[uVar19]];
        pfVar4 = local_a8[uVar19];
        pfVar5 = local_70[nodephoneids[uVar19]];
        pfVar6 = ppfVar16[uVar19];
        uVar21 = 0;
        do {
          pfVar4[uVar21] = pfVar3[uVar21];
          pfVar6[uVar21] = pfVar5[uVar21];
          uVar21 = uVar21 + 1;
        } while (uVar29 != uVar21);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != (uint)nphones);
  }
  if (npermute < nphones) {
    ppfVar27 = local_80;
    nsets = nphones;
    do {
      pvars = ppfVar16;
      pppfVar13 = local_88;
      ppfVar16 = local_90;
      ppiVar12 = local_98;
      local_58 = local_c8;
      local_80 = local_a0;
      local_a0 = local_a8;
      local_98 = local_d0;
      local_90 = ppfVar27;
      local_88 = local_b8;
      findclosestpair(local_a8,pvars,local_b8,nsets,ndensity,nfeat,ndim,&a,&b,continuous);
      if ((int)nsets < 1) {
        lVar22 = 0;
      }
      else {
        uVar19 = 0;
        iVar18 = 0;
        do {
          if ((uVar19 != (uint)a) && (uVar19 != (uint)b)) {
            lVar22 = (long)iVar18;
            *(undefined4 *)((long)local_90 + lVar22 * 4) =
                 *(undefined4 *)((long)ppfVar16 + uVar19 * 4);
            if (0 < *(int *)((long)ppfVar16 + uVar19 * 4)) {
              piVar15 = local_98[uVar19];
              piVar7 = ppiVar12[lVar22];
              lVar26 = 0;
              do {
                piVar7[lVar26] = piVar15[lVar26];
                lVar26 = lVar26 + 1;
              } while (lVar26 < *(int *)((long)ppfVar16 + uVar19 * 4));
            }
            if (0 < nfeat) {
              uVar21 = 0;
              do {
                if (0 < ndensity) {
                  pfVar3 = local_88[uVar19][uVar21];
                  pfVar4 = pppfVar13[lVar22][uVar21];
                  uVar25 = 0;
                  do {
                    pfVar4[uVar25] = pfVar3[uVar25];
                    uVar25 = uVar25 + 1;
                  } while (uVar11 != uVar25);
                }
                uVar21 = uVar21 + 1;
              } while (uVar21 != uVar28);
            }
            if (0 < ndim && continuous != 0) {
              pfVar3 = local_a0[uVar19];
              pfVar4 = local_80[lVar22];
              pfVar5 = pvars[uVar19];
              pfVar6 = local_58[lVar22];
              uVar21 = 0;
              do {
                pfVar4[uVar21] = pfVar3[uVar21];
                pfVar6[uVar21] = pfVar5[uVar21];
                uVar21 = uVar21 + 1;
              } while (uVar29 != uVar21);
            }
            iVar18 = iVar18 + 1;
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != nsets);
        lVar22 = (long)iVar18;
      }
      *(int *)((long)local_90 + lVar22 * 4) =
           *(int *)((long)ppfVar16 + (long)b * 4) + *(int *)((long)ppfVar16 + (long)a * 4);
      lVar26 = (long)a;
      if (*(int *)((long)ppfVar16 + lVar26 * 4) < 1) {
        lVar23 = 0;
      }
      else {
        piVar15 = local_98[lVar26];
        piVar7 = ppiVar12[lVar22];
        lVar23 = 0;
        do {
          piVar7[lVar23] = piVar15[lVar23];
          lVar23 = lVar23 + 1;
        } while (lVar23 < *(int *)((long)ppfVar16 + lVar26 * 4));
      }
      lVar20 = (long)b;
      if (0 < *(int *)((long)ppfVar16 + lVar20 * 4)) {
        piVar15 = local_98[lVar20];
        piVar7 = ppiVar12[lVar22];
        lVar24 = 0;
        do {
          piVar7[lVar23 + lVar24] = piVar15[lVar24];
          lVar24 = lVar24 + 1;
        } while (lVar24 < *(int *)((long)ppfVar16 + lVar20 * 4));
      }
      if (continuous == 0) {
        if (0 < nfeat) {
          uVar19 = 0;
          do {
            if (0 < ndensity) {
              pfVar3 = local_88[lVar26][uVar19];
              pfVar4 = local_88[lVar20][uVar19];
              pfVar5 = pppfVar13[lVar22][uVar19];
              uVar21 = 0;
              do {
                pfVar5[uVar21] = (float32)((float)pfVar3[uVar21] + (float)pfVar4[uVar21]);
                uVar21 = uVar21 + 1;
              } while (uVar11 != uVar21);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar28);
        }
      }
      else {
        pfVar3 = local_80[lVar22];
        pfVar4 = local_58[lVar22];
        pfVar5 = local_a0[lVar26];
        pfVar6 = pvars[lVar26];
        fVar1 = (float)**local_88[lVar26];
        fVar2 = (float)**local_88[lVar20];
        pfVar8 = local_a0[lVar20];
        pfVar9 = pvars[lVar20];
        fVar32 = fVar1 + fVar2;
        **pppfVar13[lVar22] = (float32)fVar32;
        if (0 < ndim) {
          uVar19 = 0;
          do {
            pfVar3[uVar19] =
                 (float32)(((float)pfVar5[uVar19] * fVar1 + (float)pfVar8[uVar19] * fVar2) / fVar32)
            ;
            fVar34 = (float)pfVar5[uVar19];
            fVar33 = (float)pfVar8[uVar19];
            fVar33 = (fVar34 * fVar34 + (float)pfVar6[uVar19]) * fVar1 +
                     (fVar33 * fVar33 + (float)pfVar9[uVar19]) * fVar2;
            pfVar4[uVar19] = (float32)fVar33;
            fVar34 = (float)pfVar3[uVar19];
            fVar33 = fVar33 / fVar32 - fVar34 * fVar34;
            fVar34 = fVar30;
            if (fVar30 <= fVar33) {
              fVar34 = fVar33;
            }
            pfVar4[uVar19] = (float32)fVar34;
            uVar19 = uVar19 + 1;
          } while (uVar29 != uVar19);
        }
      }
      nsets = nsets - 1;
      local_a8 = local_80;
      local_b8 = pppfVar13;
      local_d0 = ppiVar12;
      ppfVar27 = ppfVar16;
      ppfVar16 = local_58;
      local_c8 = pvars;
    } while (npermute < (int)nsets);
  }
  else {
    local_60 = (ulong)(uint)nphones;
  }
  if (nphones < 2) {
    local_48->left = (node_str *)0x0;
    local_48->right = (node_str *)0x0;
    pnVar14 = local_48;
  }
  else {
    fVar31 = permute(local_78,local_70,local_68,ndensity,nfeat,ndim,local_d0,(int32 *)local_90,
                     (int32)local_60,&lphoneids,&rphoneids,&lnphones,&rnphones,continuous);
    pnVar14 = local_48;
    local_48->lkhd_dec = fVar31;
    if (continuous != 0) {
      ckd_free_2d(local_a8);
      ckd_free_2d(ppfVar16);
      ckd_free_2d(local_a0);
      ckd_free_2d(local_c8);
    }
    ckd_free_3d(local_b8);
    ckd_free_3d(local_88);
    ckd_free_2d(local_98);
    ckd_free_2d(local_d0);
    pppfVar13 = local_68;
    npermute_00 = (int32)local_60;
    pnVar17 = make_simple_tree(local_78,local_70,local_68,lphoneids,lnphones,ndensity,nfeat,ndim,
                               npermute_00,pnVar14->depth + 1,continuous);
    pnVar14->left = pnVar17;
    pnVar17 = make_simple_tree(local_78,local_70,pppfVar13,rphoneids,rnphones,ndensity,nfeat,ndim,
                               npermute_00,pnVar14->depth + 1,continuous);
    pnVar14->right = pnVar17;
  }
  return pnVar14;
}

Assistant:

node *make_simple_tree (float32 **means, float32 **vars, float32 ***mixw,
           int32 *nodephoneids, int32 nphones, int32 ndensity, 
           int32 nfeat, int32 ndim, int32 npermute, int32 depth, int32 continuous)
{
    float32  **oldmeans=NULL, **oldvars=NULL, **newmeans=NULL, **newvars=NULL;
    float32  ***oldmixw, ***newmixw, **tmp2d, ***tmp3d;
    float32  minvar=0, bestdec;
    int32    **phoneid, **newphoneid, *numphones, *newnumphones, **it2d, *it1d;
    int32    i,j,k,l,a,b,set,nsets;
    int32    *lphoneids,*rphoneids,lnphones,rnphones;
    node     *root;

    /* Allocate and set basic root parameters */
    root = (node *) ckd_calloc(1,sizeof(node));
    root->phoneids = (int32 *) ckd_calloc(nphones,sizeof(int32));
    root->nphones = nphones;
    memcpy(root->phoneids,nodephoneids,nphones*sizeof(int32));
    root->depth = depth;

    /* Build the node by clustering and partitioning */
    oldmixw = (float32***)ckd_calloc_3d(nphones,nfeat,ndensity,sizeof(float32));
    newmixw = (float32***)ckd_calloc_3d(nphones,nfeat,ndensity,sizeof(float32));
    phoneid = (int32 **)ckd_calloc_2d(nphones,nphones,sizeof(int32));
    numphones = (int32 *) ckd_calloc(nphones,sizeof(int32));
    newphoneid = (int32 **)ckd_calloc_2d(nphones,nphones,sizeof(int32));
    newnumphones = (int32 *) ckd_calloc(nphones,sizeof(int32));

    if (continuous) {
        minvar = cmd_ln_float32("-varfloor");
        oldmeans = (float32 **) ckd_calloc_2d(nphones,ndim,sizeof(float32));
        oldvars = (float32 **) ckd_calloc_2d(nphones,ndim,sizeof(float32));
        newmeans = (float32 **) ckd_calloc_2d(nphones,ndim,sizeof(float32));
        newvars = (float32 **) ckd_calloc_2d(nphones,ndim,sizeof(float32));
    }

    for (i=0;i<nphones;i++){
        numphones[i] = 1;
        phoneid[i][0] =  nodephoneids[i]; /* Phone ids */
        for (j=0;j<nfeat;j++)
            for (k=0;k<ndensity;k++)
                oldmixw[i][j][k] = mixw[nodephoneids[i]][j][k];
        if (continuous) {
            for (l=0;l<ndim;l++){
                oldmeans[i][l] = means[nodephoneids[i]][l];
                oldvars[i][l] = vars[nodephoneids[i]][l];
            }
        }
    }
    if (nphones > npermute){

        for (nsets = nphones; nsets > npermute; nsets--) {
            /* Find the closest distributions */
            findclosestpair(oldmeans,oldvars,oldmixw,nsets,ndensity,
                                                         nfeat,ndim,&a,&b, continuous);

            /* Copy and Merge distributions... */
            /* Copy unmerged distributions first */
            for (i=0,set=0;i<nsets;i++){
                if (i != a && i != b){
                    newnumphones[set] = numphones[i];
                    for (l=0;l<numphones[i];l++)
                        newphoneid[set][l] = phoneid[i][l];
                    for (j=0;j<nfeat;j++)
                        for (k=0;k<ndensity;k++)
                            newmixw[set][j][k] = oldmixw[i][j][k];
                    if (continuous) {
                        for (l=0;l<ndim;l++){
                            newmeans[set][l] = oldmeans[i][l];
                            newvars[set][l] = oldvars[i][l];
                        }
                    }
                    set++;
                }
            }
            /* Merge a and b */
            newnumphones[set] =  numphones[a]+numphones[b];
            for (i=0;i<numphones[a];i++)
                newphoneid[set][i] = phoneid[a][i];
            for (l=0;l<numphones[b];l++,i++)
                newphoneid[set][i] = phoneid[b][l];
            if (continuous) {
                float32 *nm = newmeans[set];
                float32 *nv = newvars[set];
                float32 *oma = oldmeans[a];
                float32 *ova = oldvars[a];
                float32 *omb = oldmeans[b];
                float32 *ovb = oldvars[b];
                float32 cnta, cntb;

                cnta = oldmixw[a][0][0]; cntb = oldmixw[b][0][0];
                newmixw[set][0][0] = cnta + cntb;
                for (l=0;l<ndim;l++){
                    nm[l] = (cnta*oma[l] + cntb*omb[l]) / (cnta + cntb);
                    nv[l] = cnta*(ova[l]+oma[l]*oma[l]) +
                            cntb*(ovb[l]+omb[l]*omb[l]);
                    nv[l] = nv[l]/(cnta+cntb) - nm[l]*nm[l];
                    if (nv[l] < minvar) nv[l] = minvar;
                }
            }
            else {
                for (j=0;j<nfeat;j++)
                    for (k=0;k<ndensity;k++)
                        newmixw[set][j][k] = oldmixw[a][j][k]+oldmixw[b][j][k];
            }

            /* Switch old and new variables */
            tmp2d = oldmeans; oldmeans = newmeans; newmeans = tmp2d;
            tmp2d = oldvars;  oldvars = newvars;   newvars = tmp2d;
            tmp3d = oldmixw;  oldmixw = newmixw;   newmixw = tmp3d;
            it2d = phoneid;  phoneid = newphoneid; newphoneid = it2d;
            it1d = numphones; numphones = newnumphones; newnumphones = it1d;
        }
    }
    else npermute = nphones;

    if (nphones < 2){
        root->left = root->right = NULL; /* Dont split further */
        return(root);
    }

    bestdec = permute(means,vars,mixw,ndensity,nfeat,ndim,phoneid,numphones,
                      npermute,&lphoneids,&rphoneids,&lnphones,&rnphones, continuous);

    root->lkhd_dec = bestdec;

    if (continuous) {
        ckd_free_2d((void **)oldmeans); ckd_free_2d((void **)oldvars);
        ckd_free_2d((void **)newmeans); ckd_free_2d((void **)newvars);
    }
    ckd_free_3d((void ***)oldmixw); ckd_free_3d((void ***)newmixw);
    ckd_free_2d((void **)newphoneid); ckd_free_2d((void **)phoneid);

    /* Recurse */
    root->left = make_simple_tree(means,vars,mixw,lphoneids,lnphones,
              ndensity,nfeat,ndim,npermute,root->depth+1, continuous);
    root->right = make_simple_tree(means,vars,mixw,rphoneids,rnphones,
              ndensity,nfeat,ndim,npermute,root->depth+1, continuous);

    return(root);
}